

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_helpers.c
# Opt level: O1

int kvtree_pack_uint32_t(void *buf,size_t buf_size,size_t *buf_pos,uint32_t val)

{
  ulong uVar1;
  undefined8 uVar2;
  char *fmt;
  
  if (buf == (void *)0x0 || buf_pos == (size_t *)0x0) {
    fmt = "NULL pointer to buffer or buffer position @ %s:%d";
    uVar2 = 0x8b;
  }
  else {
    uVar1 = *buf_pos + 4;
    if (uVar1 <= buf_size) {
      *(uint32_t *)((long)buf + *buf_pos) =
           val >> 0x18 | (val & 0xff0000) >> 8 | (val & 0xff00) << 8 | val << 0x18;
      *buf_pos = uVar1;
      return 0;
    }
    fmt = "Attempting to pack too many bytes into buffer @ %s:%d";
    uVar2 = 0x99;
  }
  kvtree_err(fmt,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
             ,uVar2);
  return 1;
}

Assistant:

int kvtree_pack_uint32_t(void* buf, size_t buf_size, size_t* buf_pos, uint32_t val)
{
  /* check that we have a valid pointer to a buffer position value */
  if (buf == NULL || buf_pos == NULL) {
    kvtree_err("NULL pointer to buffer or buffer position @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* get current buffer position */
  size_t pos = *buf_pos;

  /* compute final buffer position */
  size_t pos_final = pos + sizeof(val);

  /* check that we won't overrun the buffer */
  if (pos_final > buf_size) {
    kvtree_err("Attempting to pack too many bytes into buffer @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* convert value to network order */
  uint32_t val_network = kvtree_hton32(val);

  /* pack value into buffer */
  memcpy(buf + pos, &val_network, sizeof(val_network));

  /* update position */
  *buf_pos = pos_final;

  return KVTREE_SUCCESS;
}